

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SW2048Game.cpp
# Opt level: O1

bool __thiscall SW2048Game::copyToLast(SW2048Game *this)

{
  int **ppiVar1;
  int **ppiVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  
  if (this->order < 1) {
    bVar5 = false;
  }
  else {
    ppiVar1 = this->last;
    ppiVar2 = this->board;
    lVar6 = 0;
    bVar5 = false;
    do {
      if (0 < this->order) {
        piVar3 = ppiVar1[lVar6];
        piVar4 = ppiVar2[lVar6];
        lVar7 = 0;
        do {
          if (piVar3[lVar7] != piVar4[lVar7]) {
            piVar3[lVar7] = piVar4[lVar7];
            bVar5 = true;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < this->order);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->order);
  }
  return bVar5;
}

Assistant:

bool SW2048Game::copyToLast() {
	bool result = false;
	for(int y = 0; y<order; y++)
		for (int x = 0; x < order; x++) {
			if (last[y][x] != board[y][x]) {
				last[y][x] = board[y][x];
				result = true;
			}
		}
	return result;
}